

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  ulong uVar1;
  IntermediateNode *n_00;
  byte in_DL;
  BacktrackData **in_RSI;
  long in_RDI;
  IntermediateNode *inode;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  Stack<unsigned_int> *in_stack_ffffffffffffff70;
  RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *this_00;
  anon_class_8_1_8991fb9c_for__fun function;
  undefined1 local_60 [16];
  BacktrackData **ppBStack_50;
  BacktrackData **local_48;
  byte local_11;
  BacktrackData **local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  uVar1 = (*(code *)(*in_RSI)[2]._boList)();
  if ((uVar1 & 1) == 0) {
    local_48 = local_10;
    Lib::Stack<unsigned_int>::push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    local_60._8_8_ = (BacktrackData **)0x0;
    ppBStack_50 = (BacktrackData **)0x0;
    function.this =
         (Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)(local_60 + 8);
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::Option
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               0x49f7b7);
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::operator=
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               in_stack_ffffffffffffff70,
               (Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::~Option
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               0x49f7d9);
    n_00 = (IntermediateNode *)(in_RDI + 0x100);
    this_00 = (RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_> *)local_60;
    RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>::
    selectPotentiallyUnifiableChildren<Inferences::ALASCA::SuperpositionConf::Lhs>(this_00,n_00);
    Lib::
    Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
    ::push((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
            *)function.this,
           (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
            *)this_00);
    Lib::
    VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
    ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                        *)n_00);
    if ((local_11 & 1) != 0) {
      Lib::Stack<Lib::BacktrackData>::top((Stack<Lib::BacktrackData> *)(in_RDI + 0x128));
      Lib::BacktrackData::
      addClosure<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::prepareChildren(Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node*,bool)::_lambda()_1_>
                ((BacktrackData *)this_00,function);
    }
  }
  else {
    (*(code *)(*local_10)[8]._boList)();
    Lib::some<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs*>>
              ((VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::operator=
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               in_stack_ffffffffffffff70,
               (Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_>::~Option
              ((Option<Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>_> *)
               0x49f734);
    Lib::VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*>::~VirtualIterator
              ((VirtualIterator<Inferences::ALASCA::SuperpositionConf::Lhs_*> *)
               in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }